

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  nk_panel_type type;
  int iVar1;
  nk_panel_row_layout_type nVar2;
  nk_panel *pnVar3;
  float *pfVar4;
  nk_vec2 nVar5;
  nk_vec2 nVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float local_48;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x465d,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  pnVar3 = ctx->current->layout;
  if (pnVar3 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x465e,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  iVar8 = (int)win;
  if (bounds == (nk_rect *)0x0) {
    __assert_fail("bounds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4665,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar12 = (ctx->style).window.spacing.x;
  fVar10 = (ctx->style).window.spacing.y;
  type = pnVar3->type;
  nVar5 = nk_panel_get_padding(&ctx->style,type);
  iVar1 = (pnVar3->row).columns;
  iVar7 = 1;
  if (1 < iVar1) {
    iVar7 = iVar1;
  }
  fVar9 = (pnVar3->bounds).w;
  fVar11 = (ctx->style).window.spacing.x;
  nVar6 = nk_panel_get_padding(&ctx->style,type);
  nVar2 = (pnVar3->row).type;
  if (NK_LAYOUT_TEMPLATE < nVar2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x46c3,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar11 = (fVar9 - (nVar6.x + nVar6.x)) - (float)(iVar7 + -1) * fVar11;
  switch(nVar2) {
  case NK_LAYOUT_DYNAMIC_FIXED:
    if (fVar11 <= 1.0) {
      fVar11 = 1.0;
    }
    fVar11 = fVar11 / (float)iVar1;
    goto LAB_00145c26;
  case NK_LAYOUT_DYNAMIC_ROW:
    fVar13 = (pnVar3->row).item_width;
    fVar9 = (pnVar3->row).item_offset;
    fVar11 = fVar11 * fVar13;
    fVar14 = 0.0;
    if (iVar8 != 0) {
      (pnVar3->row).item_offset = fVar12 + fVar11 + fVar9;
      (pnVar3->row).filled = fVar13 + (pnVar3->row).filled;
      (pnVar3->row).index = 0;
    }
    goto LAB_00145ece;
  case NK_LAYOUT_DYNAMIC_FREE:
    fVar12 = (pnVar3->row).item.x * fVar9 + pnVar3->at_x;
    bounds->x = fVar12;
    bounds->x = fVar12 - (float)*pnVar3->offset_x;
    fVar12 = (pnVar3->row).height;
    fVar10 = (pnVar3->row).item.y * fVar12 + pnVar3->at_y;
    bounds->y = fVar10;
    bounds->y = fVar10 - (float)*pnVar3->offset_y;
    bounds->w = fVar9 * (pnVar3->row).item.w;
    fVar12 = fVar12 * (pnVar3->row).item.h;
    goto LAB_00145e73;
  case NK_LAYOUT_DYNAMIC:
    pfVar4 = (pnVar3->row).ratio;
    if (pfVar4 == (float *)0x0) {
      __assert_fail("layout->row.ratio",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x468d,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    iVar1 = (pnVar3->row).index;
    fVar13 = pfVar4[iVar1];
    if (fVar13 < 0.0) {
      fVar13 = (pnVar3->row).item_width;
    }
    fVar14 = fVar12 * (float)iVar1;
    fVar11 = fVar11 * fVar13;
    fVar9 = (pnVar3->row).item_offset;
    if (iVar8 != 0) {
      (pnVar3->row).item_offset = fVar9 + fVar11;
      (pnVar3->row).filled = fVar13 + (pnVar3->row).filled;
    }
    goto LAB_00145ece;
  case NK_LAYOUT_STATIC_FIXED:
    fVar11 = (pnVar3->row).item_width;
LAB_00145c26:
    fVar14 = (float)(pnVar3->row).index;
    fVar9 = fVar11 * fVar14;
    fVar14 = fVar12 * fVar14;
    goto LAB_00145ece;
  case NK_LAYOUT_STATIC_ROW:
    iVar7 = (pnVar3->row).index;
    fVar11 = (pnVar3->row).item_width;
    fVar9 = (pnVar3->row).item_offset;
    break;
  case NK_LAYOUT_STATIC_FREE:
    fVar10 = pnVar3->at_x + (pnVar3->row).item.x;
    bounds->x = fVar10;
    fVar12 = (pnVar3->row).item.w;
    bounds->w = fVar12;
    if ((iVar8 != 0) &&
       (fVar12 = fVar12 + fVar10, pnVar3->max_x <= fVar12 && fVar12 != pnVar3->max_x)) {
      pnVar3->max_x = fVar12;
    }
    bounds->x = fVar10 - (float)*pnVar3->offset_x;
    fVar12 = pnVar3->at_y + (pnVar3->row).item.y;
    bounds->y = fVar12;
    bounds->y = fVar12 - (float)*pnVar3->offset_y;
    fVar12 = (pnVar3->row).item.h;
LAB_00145e73:
    bounds->h = fVar12;
    return;
  case NK_LAYOUT_STATIC:
    iVar7 = (pnVar3->row).index;
    fVar11 = (pnVar3->row).ratio[iVar7];
    fVar9 = (pnVar3->row).item_offset;
    break;
  case NK_LAYOUT_TEMPLATE:
    iVar7 = (pnVar3->row).index;
    if (iVar1 <= iVar7) {
      __assert_fail("layout->row.index < layout->row.columns",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x46bc,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    if (0xf < iVar7) {
      __assert_fail("layout->row.index < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x46bd,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    fVar11 = (pnVar3->row).templates[iVar7];
    fVar9 = (pnVar3->row).item_offset;
  }
  fVar14 = fVar12 * (float)iVar7;
  if (iVar8 != 0) {
    (pnVar3->row).item_offset = fVar11 + fVar9;
  }
LAB_00145ece:
  bounds->w = fVar11;
  bounds->h = (pnVar3->row).height - fVar10;
  bounds->y = pnVar3->at_y - (float)*pnVar3->offset_y;
  local_48 = nVar5.x;
  local_48 = fVar9 + pnVar3->at_x + fVar14 + local_48;
  bounds->x = local_48;
  if ((iVar8 != 0) &&
     (fVar11 = fVar11 + local_48, pnVar3->max_x <= fVar11 && fVar11 != pnVar3->max_x)) {
    pnVar3->max_x = fVar11;
  }
  bounds->x = local_48 - (float)*pnVar3->offset_x;
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
    struct nk_window *win, int modify)
{
    struct nk_panel *layout;
    const struct nk_style *style;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    float item_offset = 0;
    float item_width = 0;
    float item_spacing = 0;
    float panel_space = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    NK_ASSERT(bounds);

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, layout->type);
    panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                                            layout->bounds.w, layout->row.columns);

    /* calculate the width of one item inside the current layout space */
    switch (layout->row.type) {
    case NK_LAYOUT_DYNAMIC_FIXED: {
        /* scaling fixed size widgets item width */
        item_width = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_DYNAMIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width * panel_space;
        item_offset = layout->row.item_offset;
        item_spacing = 0;

        if (modify) {
            layout->row.item_offset += item_width + spacing.x;
            layout->row.filled += layout->row.item_width;
            layout->row.index = 0;
        }
    } break;
    case NK_LAYOUT_DYNAMIC_FREE: {
        /* panel width depended free widget placing */
        bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
        bounds->y -= (float)*layout->offset_y;
        bounds->w = layout->bounds.w  * layout->row.item.w;
        bounds->h = layout->row.height * layout->row.item.h;
        return;
    }
    case NK_LAYOUT_DYNAMIC: {
        /* scaling arrays of panel width ratios for every widget */
        float ratio;
        NK_ASSERT(layout->row.ratio);
        ratio = (layout->row.ratio[layout->row.index] < 0) ?
            layout->row.item_width : layout->row.ratio[layout->row.index];

        item_spacing = (float)layout->row.index * spacing.x;
        item_width = (ratio * panel_space);
        item_offset = layout->row.item_offset;

        if (modify) {
            layout->row.item_offset += item_width;
            layout->row.filled += ratio;
        }
    } break;
    case NK_LAYOUT_STATIC_FIXED: {
        /* non-scaling fixed widgets item width */
        item_width = layout->row.item_width;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_STATIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width;
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_STATIC_FREE: {
        /* free widget placing */
        bounds->x = layout->at_x + layout->row.item.x;
        bounds->w = layout->row.item.w;
        if (((bounds->x + bounds->w) > layout->max_x) && modify)
            layout->max_x = (bounds->x + bounds->w);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + layout->row.item.y;
        bounds->y -= (float)*layout->offset_y;
        bounds->h = layout->row.item.h;
        return;
    }
    case NK_LAYOUT_STATIC: {
        /* non-scaling array of panel pixel width for every widget */
        item_spacing = (float)layout->row.index * spacing.x;
        item_width = layout->row.ratio[layout->row.index];
        item_offset = layout->row.item_offset;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_TEMPLATE: {
        /* stretchy row layout with combined dynamic/static widget width*/
        NK_ASSERT(layout->row.index < layout->row.columns);
        NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
        item_width = layout->row.templates[layout->row.index];
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    default: NK_ASSERT(0); break;
    };

    /* set the bounds of the newly allocated widget */
    bounds->w = item_width;
    bounds->h = layout->row.height - spacing.y;
    bounds->y = layout->at_y - (float)*layout->offset_y;
    bounds->x = layout->at_x + item_offset + item_spacing + padding.x;
    if (((bounds->x + bounds->w) > layout->max_x) && modify)
        layout->max_x = bounds->x + bounds->w;
    bounds->x -= (float)*layout->offset_x;
}